

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O2

int Fra_OneHotNodesAreEqual(Fra_Sml_t *pSeq,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = pSeq->nWordsTotal;
  lVar4 = (long)pSeq->nWordsPref;
  do {
    if (iVar3 <= lVar4) {
      return 1;
    }
    lVar1 = lVar4 * 4;
    lVar2 = lVar4 * 4;
    lVar4 = lVar4 + 1;
  } while (*(int *)((long)&pSeq[1].pAig + lVar1 + (long)(pObj0->Id * iVar3) * 4) ==
           *(int *)((long)&pSeq[1].pAig + lVar2 + (long)(pObj1->Id * iVar3) * 4));
  return 0;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }